

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov5.cpp
# Opt level: O0

int detect_yolov5(Mat *bgr,vector<Object,_std::allocator<Object>_> *objects)

{
  int iVar1;
  int iVar2;
  const_iterator __position;
  const_iterator __position_00;
  const_iterator __position_01;
  uint uVar3;
  float *pfVar4;
  iterator iVar5;
  vector<Object,_std::allocator<Object>_> *objects_00;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  vector<Object,_std::allocator<Object>_> *in_RSI;
  long in_RDI;
  float fVar9;
  float y1;
  float x1;
  float y0;
  float x0;
  int i;
  int count;
  vector<int,_std::allocator<int>_> picked;
  vector<Object,_std::allocator<Object>_> objects32;
  Mat anchors_2;
  Mat out_2;
  vector<Object,_std::allocator<Object>_> objects16;
  Mat anchors_1;
  Mat out_1;
  vector<Object,_std::allocator<Object>_> objects8;
  Mat anchors;
  Mat out;
  vector<Object,_std::allocator<Object>_> proposals;
  Extractor ex;
  float norm_vals [3];
  Mat in_pad;
  int hpad;
  int wpad;
  Mat in;
  float scale;
  int h;
  int w;
  int img_h;
  int img_w;
  float nms_threshold;
  float prob_threshold;
  int target_size;
  Net yolov5;
  undefined4 uVar10;
  undefined4 in_stack_fffffffffffffa1c;
  Option *this;
  Net *this_00;
  undefined4 in_stack_fffffffffffffa28;
  int in_stack_fffffffffffffa2c;
  float in_stack_fffffffffffffa30;
  float in_stack_fffffffffffffa34;
  undefined4 in_stack_fffffffffffffa38;
  undefined4 in_stack_fffffffffffffa3c;
  Net *in_stack_fffffffffffffa40;
  Mat *in_stack_fffffffffffffa48;
  char *in_stack_fffffffffffffa50;
  Extractor *in_stack_fffffffffffffa58;
  vector<Object,_std::allocator<Object>_> *in_stack_fffffffffffffa60;
  __normal_iterator<Object_*,_std::vector<Object,_std::allocator<Object>_>_>
  in_stack_fffffffffffffa68;
  __normal_iterator<Object_*,_std::vector<Object,_std::allocator<Object>_>_>
  in_stack_fffffffffffffa70;
  undefined4 in_stack_fffffffffffffa78;
  undefined4 in_stack_fffffffffffffa7c;
  int in_stack_fffffffffffffa80;
  Option *in_stack_fffffffffffffa88;
  vector<Object,_std::allocator<Object>_> *faceobjects;
  vector<Object,_std::allocator<Object>_> *in_stack_fffffffffffffb28;
  undefined8 in_stack_fffffffffffffb30;
  Mat *in_stack_fffffffffffffb38;
  Mat *feat_blob;
  Mat *in_stack_fffffffffffffb40;
  Mat *in_pad_00;
  undefined8 in_stack_fffffffffffffb48;
  int iVar11;
  Mat *anchors_00;
  float local_460;
  float local_45c;
  float local_458;
  float local_454;
  float local_450;
  float local_44c;
  float local_448;
  float local_444;
  float local_440;
  float local_43c;
  float local_438;
  float local_434;
  int local_430;
  int local_42c;
  vector<int,_std::allocator<int>_> local_428;
  Object *local_410;
  Object *local_408;
  Object *local_400;
  Object *local_3f8;
  vector<Object,_std::allocator<Object>_> local_3e8;
  Mat local_3d0;
  Mat local_388;
  Object *local_340;
  Object *local_338;
  Object *local_330;
  Object *local_328;
  Mat local_300;
  Mat local_2b8;
  Object *local_270;
  Object *local_268;
  Object *local_260;
  Object *local_258;
  undefined1 local_248 [96];
  Mat local_1e8;
  Mat local_1a0;
  float *in_stack_fffffffffffffed0;
  float *in_stack_fffffffffffffed8;
  Mat *in_stack_fffffffffffffee0;
  float local_8c;
  int local_88;
  int local_84;
  
  iVar11 = (int)((ulong)in_stack_fffffffffffffb48 >> 0x20);
  fVar9 = (float)((ulong)in_stack_fffffffffffffb30 >> 0x20);
  ncnn::Net::Net(in_stack_fffffffffffffa40);
  ncnn::Net::load_param
            ((Net *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38),
             (char *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30));
  ncnn::Net::load_model
            ((Net *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38),
             (char *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30));
  iVar1 = *(int *)(in_RDI + 0xc);
  iVar2 = *(int *)(in_RDI + 8);
  if (iVar2 < iVar1) {
    local_8c = 640.0 / (float)iVar1;
    local_84 = 0x280;
    local_88 = (int)((float)iVar2 * local_8c);
  }
  else {
    local_8c = 640.0 / (float)iVar2;
    local_88 = 0x280;
    local_84 = (int)((float)iVar1 * local_8c);
  }
  this = (Option *)0x0;
  ncnn::Mat::from_pixels_resize
            ((uchar *)in_stack_fffffffffffffa58,(int)((ulong)in_stack_fffffffffffffa50 >> 0x20),
             (int)in_stack_fffffffffffffa50,(int)((ulong)in_stack_fffffffffffffa48 >> 0x20),
             (int)in_stack_fffffffffffffa48,(int)in_stack_fffffffffffffa70._M_current,
             (Allocator *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
  uVar3 = local_84 + 0x3fU;
  if ((int)(local_84 + 0x3fU) < 0) {
    uVar3 = local_84 + 0x7e;
  }
  local_84 = (uVar3 & 0xffffffc0) - local_84;
  uVar3 = local_88 + 0x3fU;
  if ((int)(local_88 + 0x3fU) < 0) {
    uVar3 = local_88 + 0x7e;
  }
  local_88 = (uVar3 & 0xffffffc0) - local_88;
  ncnn::Mat::Mat((Mat *)&stack0xfffffffffffffed8);
  ncnn::Option::Option(this);
  this_00 = (Net *)&local_1a0.c;
  uVar10 = 0;
  ncnn::copy_make_border
            ((Mat *)in_stack_fffffffffffffa70._M_current,(Mat *)in_stack_fffffffffffffa68._M_current
             ,(int)((ulong)in_stack_fffffffffffffa60 >> 0x20),(int)in_stack_fffffffffffffa60,
             (int)((ulong)in_stack_fffffffffffffa58 >> 0x20),(int)in_stack_fffffffffffffa58,
             in_stack_fffffffffffffa80,(float)((ulong)in_stack_fffffffffffffa50 >> 0x20),
             in_stack_fffffffffffffa88);
  local_1a0.dims = 0x3b808081;
  local_1a0.w = 0x3b808081;
  local_1a0.h = 0x3b808081;
  ncnn::Mat::substract_mean_normalize
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  ncnn::Net::create_extractor((Net *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
  ncnn::Extractor::input
            (in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  std::vector<Object,_std::allocator<Object>_>::vector
            ((vector<Object,_std::allocator<Object>_> *)0x143c82);
  ncnn::Mat::Mat(&local_1e8);
  ncnn::Extractor::extract
            (in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
             (int)((ulong)in_stack_fffffffffffffa40 >> 0x20));
  ncnn::Mat::Mat((Mat *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                 in_stack_fffffffffffffa2c,(size_t)this_00,
                 (Allocator *)CONCAT44(in_stack_fffffffffffffa1c,uVar10));
  pfVar4 = ncnn::Mat::operator[]((Mat *)(local_248 + 0x18),0);
  *pfVar4 = 10.0;
  pfVar4 = ncnn::Mat::operator[]((Mat *)(local_248 + 0x18),1);
  *pfVar4 = 13.0;
  pfVar4 = ncnn::Mat::operator[]((Mat *)(local_248 + 0x18),2);
  *pfVar4 = 16.0;
  pfVar4 = ncnn::Mat::operator[]((Mat *)(local_248 + 0x18),3);
  *pfVar4 = 30.0;
  pfVar4 = ncnn::Mat::operator[]((Mat *)(local_248 + 0x18),4);
  *pfVar4 = 33.0;
  pfVar4 = ncnn::Mat::operator[]((Mat *)(local_248 + 0x18),5);
  *pfVar4 = 23.0;
  anchors_00 = (Mat *)local_248;
  std::vector<Object,_std::allocator<Object>_>::vector
            ((vector<Object,_std::allocator<Object>_> *)0x143dde);
  generate_proposals(anchors_00,iVar11,in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,fVar9,
                     in_stack_fffffffffffffb28);
  in_pad_00 = &local_1a0;
  local_258 = (Object *)
              std::vector<Object,_std::allocator<Object>_>::end
                        ((vector<Object,_std::allocator<Object>_> *)
                         CONCAT44(in_stack_fffffffffffffa1c,uVar10));
  __gnu_cxx::__normal_iterator<Object_const*,std::vector<Object,std::allocator<Object>>>::
  __normal_iterator<Object*>
            ((__normal_iterator<const_Object_*,_std::vector<Object,_std::allocator<Object>_>_> *)
             this_00,(__normal_iterator<Object_*,_std::vector<Object,_std::allocator<Object>_>_> *)
                     CONCAT44(in_stack_fffffffffffffa1c,uVar10));
  feat_blob = (Mat *)local_248;
  local_260 = (Object *)
              std::vector<Object,_std::allocator<Object>_>::begin
                        ((vector<Object,_std::allocator<Object>_> *)
                         CONCAT44(in_stack_fffffffffffffa1c,uVar10));
  local_268 = (Object *)
              std::vector<Object,_std::allocator<Object>_>::end
                        ((vector<Object,_std::allocator<Object>_> *)
                         CONCAT44(in_stack_fffffffffffffa1c,uVar10));
  __position._M_current._4_4_ = in_stack_fffffffffffffa7c;
  __position._M_current._0_4_ = in_stack_fffffffffffffa78;
  iVar5 = std::vector<Object,std::allocator<Object>>::
          insert<__gnu_cxx::__normal_iterator<Object*,std::vector<Object,std::allocator<Object>>>,void>
                    (in_stack_fffffffffffffa60,__position,in_stack_fffffffffffffa70,
                     in_stack_fffffffffffffa68);
  local_270 = iVar5._M_current;
  std::vector<Object,_std::allocator<Object>_>::~vector
            ((vector<Object,_std::allocator<Object>_> *)
             CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30));
  iVar11 = (int)((ulong)iVar5._M_current >> 0x20);
  ncnn::Mat::~Mat((Mat *)0x143ecf);
  ncnn::Mat::~Mat((Mat *)0x143edc);
  ncnn::Mat::Mat(&local_2b8);
  ncnn::Extractor::extract
            (in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
             (int)((ulong)in_stack_fffffffffffffa40 >> 0x20));
  ncnn::Mat::Mat((Mat *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                 in_stack_fffffffffffffa2c,(size_t)this_00,
                 (Allocator *)CONCAT44(in_stack_fffffffffffffa1c,uVar10));
  pfVar4 = ncnn::Mat::operator[](&local_300,0);
  *pfVar4 = 30.0;
  objects_00 = (vector<Object,_std::allocator<Object>_> *)ncnn::Mat::operator[](&local_300,1);
  fVar9 = (float)((ulong)pfVar4 >> 0x20);
  *(float *)&(objects_00->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
             super__Vector_impl_data._M_start = 61.0;
  pfVar4 = ncnn::Mat::operator[](&local_300,2);
  *pfVar4 = 62.0;
  pfVar4 = ncnn::Mat::operator[](&local_300,3);
  *pfVar4 = 45.0;
  pfVar4 = ncnn::Mat::operator[](&local_300,4);
  *pfVar4 = 59.0;
  pfVar4 = ncnn::Mat::operator[](&local_300,5);
  *pfVar4 = 119.0;
  std::vector<Object,_std::allocator<Object>_>::vector
            ((vector<Object,_std::allocator<Object>_> *)0x144038);
  generate_proposals(anchors_00,iVar11,in_pad_00,feat_blob,fVar9,objects_00);
  local_328 = (Object *)
              std::vector<Object,_std::allocator<Object>_>::end
                        ((vector<Object,_std::allocator<Object>_> *)
                         CONCAT44(in_stack_fffffffffffffa1c,uVar10));
  __gnu_cxx::__normal_iterator<Object_const*,std::vector<Object,std::allocator<Object>>>::
  __normal_iterator<Object*>
            ((__normal_iterator<const_Object_*,_std::vector<Object,_std::allocator<Object>_>_> *)
             this_00,(__normal_iterator<Object_*,_std::vector<Object,_std::allocator<Object>_>_> *)
                     CONCAT44(in_stack_fffffffffffffa1c,uVar10));
  local_330 = (Object *)
              std::vector<Object,_std::allocator<Object>_>::begin
                        ((vector<Object,_std::allocator<Object>_> *)
                         CONCAT44(in_stack_fffffffffffffa1c,uVar10));
  local_338 = (Object *)
              std::vector<Object,_std::allocator<Object>_>::end
                        ((vector<Object,_std::allocator<Object>_> *)
                         CONCAT44(in_stack_fffffffffffffa1c,uVar10));
  __position_00._M_current._4_4_ = in_stack_fffffffffffffa7c;
  __position_00._M_current._0_4_ = in_stack_fffffffffffffa78;
  local_340 = (Object *)
              std::vector<Object,std::allocator<Object>>::
              insert<__gnu_cxx::__normal_iterator<Object*,std::vector<Object,std::allocator<Object>>>,void>
                        (in_stack_fffffffffffffa60,__position_00,in_stack_fffffffffffffa70,
                         in_stack_fffffffffffffa68);
  std::vector<Object,_std::allocator<Object>_>::~vector
            ((vector<Object,_std::allocator<Object>_> *)
             CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30));
  ncnn::Mat::~Mat((Mat *)0x144129);
  ncnn::Mat::~Mat((Mat *)0x144136);
  ncnn::Mat::Mat(&local_388);
  ncnn::Extractor::extract
            (in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
             (int)((ulong)in_stack_fffffffffffffa40 >> 0x20));
  ncnn::Mat::Mat((Mat *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                 in_stack_fffffffffffffa2c,(size_t)this_00,
                 (Allocator *)CONCAT44(in_stack_fffffffffffffa1c,uVar10));
  pfVar4 = ncnn::Mat::operator[](&local_3d0,0);
  *pfVar4 = 116.0;
  pfVar4 = ncnn::Mat::operator[](&local_3d0,1);
  *pfVar4 = 90.0;
  pfVar4 = ncnn::Mat::operator[](&local_3d0,2);
  *pfVar4 = 156.0;
  pfVar4 = ncnn::Mat::operator[](&local_3d0,3);
  *pfVar4 = 198.0;
  pfVar4 = ncnn::Mat::operator[](&local_3d0,4);
  *pfVar4 = 373.0;
  pfVar4 = ncnn::Mat::operator[](&local_3d0,5);
  *pfVar4 = 326.0;
  faceobjects = &local_3e8;
  std::vector<Object,_std::allocator<Object>_>::vector
            ((vector<Object,_std::allocator<Object>_> *)0x144292);
  generate_proposals(anchors_00,iVar11,in_pad_00,feat_blob,fVar9,objects_00);
  fVar9 = (float)((ulong)&local_1a0 >> 0x20);
  local_3f8 = (Object *)
              std::vector<Object,_std::allocator<Object>_>::end
                        ((vector<Object,_std::allocator<Object>_> *)
                         CONCAT44(in_stack_fffffffffffffa1c,uVar10));
  __gnu_cxx::__normal_iterator<Object_const*,std::vector<Object,std::allocator<Object>>>::
  __normal_iterator<Object*>
            ((__normal_iterator<const_Object_*,_std::vector<Object,_std::allocator<Object>_>_> *)
             this_00,(__normal_iterator<Object_*,_std::vector<Object,_std::allocator<Object>_>_> *)
                     CONCAT44(in_stack_fffffffffffffa1c,uVar10));
  local_400 = (Object *)
              std::vector<Object,_std::allocator<Object>_>::begin
                        ((vector<Object,_std::allocator<Object>_> *)
                         CONCAT44(in_stack_fffffffffffffa1c,uVar10));
  local_408 = (Object *)
              std::vector<Object,_std::allocator<Object>_>::end
                        ((vector<Object,_std::allocator<Object>_> *)
                         CONCAT44(in_stack_fffffffffffffa1c,uVar10));
  __position_01._M_current._4_4_ = in_stack_fffffffffffffa7c;
  __position_01._M_current._0_4_ = in_stack_fffffffffffffa78;
  iVar5 = std::vector<Object,std::allocator<Object>>::
          insert<__gnu_cxx::__normal_iterator<Object*,std::vector<Object,std::allocator<Object>>>,void>
                    (in_stack_fffffffffffffa60,__position_01,in_stack_fffffffffffffa70,
                     in_stack_fffffffffffffa68);
  local_410 = iVar5._M_current;
  std::vector<Object,_std::allocator<Object>_>::~vector
            ((vector<Object,_std::allocator<Object>_> *)
             CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30));
  ncnn::Mat::~Mat((Mat *)0x144383);
  ncnn::Mat::~Mat((Mat *)0x144390);
  qsort_descent_inplace((vector<Object,_std::allocator<Object>_> *)this_00);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1443b1);
  nms_sorted_bboxes(faceobjects,(vector<int,_std::allocator<int>_> *)iVar5._M_current,fVar9);
  sVar6 = std::vector<int,_std::allocator<int>_>::size(&local_428);
  local_42c = (int)sVar6;
  std::vector<Object,_std::allocator<Object>_>::resize
            ((vector<Object,_std::allocator<Object>_> *)in_stack_fffffffffffffa40,
             CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38));
  for (local_430 = 0; local_430 < local_42c; local_430 = local_430 + 1) {
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_428,(long)local_430);
    std::vector<Object,_std::allocator<Object>_>::operator[]
              ((vector<Object,_std::allocator<Object>_> *)&local_1a0,(long)*pvVar7);
    std::vector<Object,_std::allocator<Object>_>::operator[](in_RSI,(long)local_430);
    Object::operator=((Object *)this_00,(Object *)CONCAT44(in_stack_fffffffffffffa1c,uVar10));
    pvVar8 = std::vector<Object,_std::allocator<Object>_>::operator[](in_RSI,(long)local_430);
    local_434 = ((pvVar8->rect).x - (float)(local_84 / 2)) / local_8c;
    pvVar8 = std::vector<Object,_std::allocator<Object>_>::operator[](in_RSI,(long)local_430);
    local_438 = ((pvVar8->rect).y - (float)(local_88 / 2)) / local_8c;
    pvVar8 = std::vector<Object,_std::allocator<Object>_>::operator[](in_RSI,(long)local_430);
    fVar9 = (pvVar8->rect).x;
    pvVar8 = std::vector<Object,_std::allocator<Object>_>::operator[](in_RSI,(long)local_430);
    local_43c = ((fVar9 + (pvVar8->rect).width) - (float)(local_84 / 2)) / local_8c;
    pvVar8 = std::vector<Object,_std::allocator<Object>_>::operator[](in_RSI,(long)local_430);
    fVar9 = (pvVar8->rect).y;
    pvVar8 = std::vector<Object,_std::allocator<Object>_>::operator[](in_RSI,(long)local_430);
    local_440 = ((fVar9 + (pvVar8->rect).height) - (float)(local_88 / 2)) / local_8c;
    local_444 = (float)(iVar1 + -1);
    pfVar4 = std::min<float>(&local_434,&local_444);
    local_448 = 0.0;
    pfVar4 = std::max<float>(pfVar4,&local_448);
    local_434 = *pfVar4;
    local_44c = (float)(iVar2 + -1);
    pfVar4 = std::min<float>(&local_438,&local_44c);
    local_450 = 0.0;
    pfVar4 = std::max<float>(pfVar4,&local_450);
    local_438 = *pfVar4;
    local_454 = (float)(iVar1 + -1);
    pfVar4 = std::min<float>(&local_43c,&local_454);
    local_458 = 0.0;
    pfVar4 = std::max<float>(pfVar4,&local_458);
    local_43c = *pfVar4;
    local_45c = (float)(iVar2 + -1);
    pfVar4 = std::min<float>(&local_440,&local_45c);
    local_460 = 0.0;
    pfVar4 = std::max<float>(pfVar4,&local_460);
    local_440 = *pfVar4;
    in_stack_fffffffffffffa30 = local_434;
    pvVar8 = std::vector<Object,_std::allocator<Object>_>::operator[](in_RSI,(long)local_430);
    (pvVar8->rect).x = in_stack_fffffffffffffa30;
    in_stack_fffffffffffffa34 = local_438;
    pvVar8 = std::vector<Object,_std::allocator<Object>_>::operator[](in_RSI,(long)local_430);
    (pvVar8->rect).y = in_stack_fffffffffffffa34;
    fVar9 = local_43c - local_434;
    pvVar8 = std::vector<Object,_std::allocator<Object>_>::operator[](in_RSI,(long)local_430);
    (pvVar8->rect).width = fVar9;
    fVar9 = local_440 - local_438;
    pvVar8 = std::vector<Object,_std::allocator<Object>_>::operator[](in_RSI,(long)local_430);
    (pvVar8->rect).height = fVar9;
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30));
  std::vector<Object,_std::allocator<Object>_>::~vector
            ((vector<Object,_std::allocator<Object>_> *)
             CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30));
  ncnn::Extractor::~Extractor((Extractor *)this_00);
  ncnn::Mat::~Mat((Mat *)0x144a56);
  ncnn::Mat::~Mat((Mat *)0x144a63);
  ncnn::Net::~Net(this_00);
  return 0;
}

Assistant:

static int detect_yolov5(const cv::Mat& bgr, std::vector<Object>& objects)
{
    ncnn::Net yolov5;

    yolov5.opt.use_vulkan_compute = true;
    // yolov5.opt.use_bf16_storage = true;

    // original pretrained model from https://github.com/ultralytics/yolov5
    // the ncnn model https://github.com/nihui/ncnn-assets/tree/master/models
#if YOLOV5_V60
    yolov5.load_param("yolov5s_6.0.param");
    yolov5.load_model("yolov5s_6.0.bin");
#else
    yolov5.register_custom_layer("YoloV5Focus", YoloV5Focus_layer_creator);

    yolov5.load_param("yolov5s.param");
    yolov5.load_model("yolov5s.bin");
#endif

    const int target_size = 640;
    const float prob_threshold = 0.25f;
    const float nms_threshold = 0.45f;

    int img_w = bgr.cols;
    int img_h = bgr.rows;

    // letterbox pad to multiple of MAX_STRIDE
    int w = img_w;
    int h = img_h;
    float scale = 1.f;
    if (w > h)
    {
        scale = (float)target_size / w;
        w = target_size;
        h = h * scale;
    }
    else
    {
        scale = (float)target_size / h;
        h = target_size;
        w = w * scale;
    }

    ncnn::Mat in = ncnn::Mat::from_pixels_resize(bgr.data, ncnn::Mat::PIXEL_BGR2RGB, img_w, img_h, w, h);

    // pad to target_size rectangle
    // yolov5/utils/datasets.py letterbox
    int wpad = (w + MAX_STRIDE - 1) / MAX_STRIDE * MAX_STRIDE - w;
    int hpad = (h + MAX_STRIDE - 1) / MAX_STRIDE * MAX_STRIDE - h;
    ncnn::Mat in_pad;
    ncnn::copy_make_border(in, in_pad, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, ncnn::BORDER_CONSTANT, 114.f);

    const float norm_vals[3] = {1 / 255.f, 1 / 255.f, 1 / 255.f};
    in_pad.substract_mean_normalize(0, norm_vals);

    ncnn::Extractor ex = yolov5.create_extractor();

    ex.input("images", in_pad);

    std::vector<Object> proposals;

    // anchor setting from yolov5/models/yolov5s.yaml

    // stride 8
    {
        ncnn::Mat out;
        ex.extract("output", out);

        ncnn::Mat anchors(6);
        anchors[0] = 10.f;
        anchors[1] = 13.f;
        anchors[2] = 16.f;
        anchors[3] = 30.f;
        anchors[4] = 33.f;
        anchors[5] = 23.f;

        std::vector<Object> objects8;
        generate_proposals(anchors, 8, in_pad, out, prob_threshold, objects8);

        proposals.insert(proposals.end(), objects8.begin(), objects8.end());
    }

    // stride 16
    {
        ncnn::Mat out;
#if YOLOV5_V60
        ex.extract("376", out);
#else
        ex.extract("781", out);
#endif

        ncnn::Mat anchors(6);
        anchors[0] = 30.f;
        anchors[1] = 61.f;
        anchors[2] = 62.f;
        anchors[3] = 45.f;
        anchors[4] = 59.f;
        anchors[5] = 119.f;

        std::vector<Object> objects16;
        generate_proposals(anchors, 16, in_pad, out, prob_threshold, objects16);

        proposals.insert(proposals.end(), objects16.begin(), objects16.end());
    }

    // stride 32
    {
        ncnn::Mat out;
#if YOLOV5_V60
        ex.extract("401", out);
#else
        ex.extract("801", out);
#endif
        ncnn::Mat anchors(6);
        anchors[0] = 116.f;
        anchors[1] = 90.f;
        anchors[2] = 156.f;
        anchors[3] = 198.f;
        anchors[4] = 373.f;
        anchors[5] = 326.f;

        std::vector<Object> objects32;
        generate_proposals(anchors, 32, in_pad, out, prob_threshold, objects32);

        proposals.insert(proposals.end(), objects32.begin(), objects32.end());
    }

    // sort all proposals by score from highest to lowest
    qsort_descent_inplace(proposals);

    // apply nms with nms_threshold
    std::vector<int> picked;
    nms_sorted_bboxes(proposals, picked, nms_threshold);

    int count = picked.size();

    objects.resize(count);
    for (int i = 0; i < count; i++)
    {
        objects[i] = proposals[picked[i]];

        // adjust offset to original unpadded
        float x0 = (objects[i].rect.x - (wpad / 2)) / scale;
        float y0 = (objects[i].rect.y - (hpad / 2)) / scale;
        float x1 = (objects[i].rect.x + objects[i].rect.width - (wpad / 2)) / scale;
        float y1 = (objects[i].rect.y + objects[i].rect.height - (hpad / 2)) / scale;

        // clip
        x0 = std::max(std::min(x0, (float)(img_w - 1)), 0.f);
        y0 = std::max(std::min(y0, (float)(img_h - 1)), 0.f);
        x1 = std::max(std::min(x1, (float)(img_w - 1)), 0.f);
        y1 = std::max(std::min(y1, (float)(img_h - 1)), 0.f);

        objects[i].rect.x = x0;
        objects[i].rect.y = y0;
        objects[i].rect.width = x1 - x0;
        objects[i].rect.height = y1 - y0;
    }

    return 0;
}